

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
::InnerMap::DestroyNode(InnerMap *this,Node *node)

{
  if ((node != (Node *)0x0) && ((this->alloc_).arena_ == (Arena *)0x0)) {
    CoreML::Specification::CustomModel_CustomModelParamValue::~CustomModel_CustomModelParamValue
              ((CustomModel_CustomModelParamValue *)&node->field_0x20);
    if (*(undefined1 **)node != &node->field_0x10) {
      operator_delete(*(undefined1 **)node,*(long *)&node->field_0x10 + 1);
    }
    operator_delete(node,0x48);
    return;
  }
  return;
}

Assistant:

void DestroyNode(Node* node) {
      if (alloc_.arena() == nullptr) {
        delete node;
      }
    }